

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O2

CodeGenRecyclableData * __thiscall
NativeCodeGenerator::GatherCodeGenData
          (NativeCodeGenerator *this,FunctionBody *topFunctionBody,FunctionBody *functionBody,
          EntryPointInfo *entryPoint,CodeGenWorkItem *workItem,void *function)

{
  byte bVar1;
  ThreadContextId pvVar2;
  ScriptContextProfiler *profiler;
  PolymorphicInlineCacheInfoIDL *selfInfo;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  LocalFunctionId LVar6;
  int iVar7;
  ThreadContextId pvVar8;
  undefined4 *puVar9;
  FunctionCodeGenJitTimeData *jitTimeData;
  TempArenaAllocatorObject *tempAllocator;
  Type objTypeSpecFldInfoList;
  undefined4 extraout_var;
  char16 *pcVar10;
  undefined8 uVar11;
  char16 *pcVar12;
  JavascriptFunction *function_00;
  NativeEntryPointData *pNVar13;
  PropertyId *ptr;
  FieldAccessStats *this_00;
  ScriptContext *this_01;
  undefined4 extraout_var_00;
  Recycler *this_02;
  WriteBarrierPtr<ObjTypeSpecFldInfo> *array;
  Type *ppOVar14;
  EntryPointPolymorphicInlineCacheInfo *runtimeInfo;
  Recycler *pRVar15;
  CodeGenRecyclableData *this_03;
  uint uVar16;
  ulong count;
  wchar local_1a8 [4];
  char16 debugStringBuffer2 [42];
  wchar local_148 [4];
  char16 debugStringBuffer [42];
  undefined1 local_e8 [8];
  InliningDecider inliningDecider;
  undefined **local_80;
  Type stats;
  AutoProfile local_58;
  AutoProfile autoProfile;
  
  pvVar2 = this->mainThreadId;
  pvVar8 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  if (pvVar2 != pvVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0xc2c,"(mainThreadId == GetCurrentThreadContextId())",
                       "Cannot use this member of native code generator from thread other than the creating context\'s current thread"
                      );
    if (!bVar4) goto LAB_0058ff7b;
    *puVar9 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0xc2d,"(functionBody)","functionBody");
    if (!bVar4) {
LAB_0058ff7b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  profiler = this->foregroundCodeGenProfiler;
  inliningDecider._64_8_ = function;
  local_58.codeGenProfiler = profiler;
  ProfileBegin(profiler,DelayPhase);
  ProfileBegin(profiler,GatherCodeGenDataPhase);
  pRVar15 = this->scriptContext->recycler;
  jitTimeData = Js::FunctionCodeGenJitTimeData::New
                          (pRVar15,(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                                   functionInfo.ptr,entryPoint,true);
  bVar1 = (workItem->jitData).type;
  bVar4 = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)functionBody);
  InliningDecider::InliningDecider
            ((InliningDecider *)local_e8,functionBody,bVar1 == '\x01',bVar4,
             (workItem->jitData).jitMode);
  tempAllocator = Js::ScriptContext::GetTemporaryAllocator(this->scriptContext,L"GatherCodeGenData")
  ;
  autoProfile.codeGenProfiler = (ScriptContextProfiler *)functionBody;
  objTypeSpecFldInfoList.ptr =
       (FieldAccessStats *)
       new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)&tempAllocator->allocator,0x3d6ef4);
  *(FieldAccessStats **)objTypeSpecFldInfoList.ptr = objTypeSpecFldInfoList.ptr;
  ((RealCount *)&(objTypeSpecFldInfoList.ptr)->monoInlineCacheCount)->count = 0;
  *(Type **)&(objTypeSpecFldInfoList.ptr)->polyInlineCacheCount = &tempAllocator->allocator;
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar5,LVar6);
  if (bVar4) {
LAB_0058fb61:
    iVar7 = (*(topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                      (topFunctionBody);
    pcVar10 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)topFunctionBody,(wchar (*) [42])local_148);
    uVar11 = (**(code **)&((autoProfile.codeGenProfiler)->profilerArena->
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                          super_ArenaData.lockBlockList)();
    pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)autoProfile.codeGenProfiler,(wchar (*) [42])local_1a8);
    Output::Print(L"ObjTypeSpec: top function %s (%s), function %s (%s): GatherCodeGenData(): \n",
                  CONCAT44(extraout_var,iVar7),pcVar10,uVar11,pcVar12);
  }
  else {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,EquivObjTypeSpecPhase,uVar5,LVar6);
    if (bVar4) goto LAB_0058fb61;
  }
  if (inliningDecider._64_8_ == 0) {
    function_00 = (JavascriptFunction *)0x0;
  }
  else {
    function_00 = Js::VarTo<Js::JavascriptFunction>((Var)inliningDecider._64_8_);
  }
  GatherCodeGenData<false>
            (this,pRVar15,topFunctionBody,(FunctionBody *)autoProfile.codeGenProfiler,entryPoint,
             (InliningDecider *)local_e8,(ObjTypeSpecFldInfoList *)objTypeSpecFldInfoList.ptr,
             jitTimeData,(FunctionCodeGenRuntimeData *)0x0,function_00,false,0);
  pNVar13 = Js::EntryPointInfo::GetNativeEntryPointData(entryPoint);
  ptr = NativeEntryPointData::GetSharedPropertyGuards
                  (pNVar13,pRVar15,&jitTimeData->sharedPropertyGuardCount);
  Memory::WriteBarrierPtr<int>::WriteBarrierSet(&jitTimeData->sharedPropertyGuards,ptr);
  this_00 = Js::EntryPointInfo::EnsureFieldAccessStats(entryPoint,pRVar15);
  Js::FieldAccessStats::Add(this_00,(jitTimeData->inlineCacheStats).ptr);
  this_01 = Js::EntryPointInfo::GetScriptContext(entryPoint);
  Js::ScriptContext::RecordFieldAccessStats(this_01,topFunctionBody,this_00);
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar5,LVar6);
  if (!bVar4) {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,EquivObjTypeSpecPhase,uVar5,LVar6);
    if (!bVar4) goto LAB_0058fd80;
  }
  Memory::WriteBarrierPtr<Js::FieldAccessStats>::WriteBarrierPtr
            ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xffffffffffffff80,
             &jitTimeData->inlineCacheStats);
  iVar7 = (*(topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                    (topFunctionBody);
  pcVar10 = Js::FunctionProxy::GetDebugNumberSet
                      ((FunctionProxy *)topFunctionBody,(wchar (*) [42])local_148);
  Output::Print(L"ObjTypeSpec: gathered code gen data for function %s (%s): inline cache stats:\n",
                CONCAT44(extraout_var_00,iVar7),pcVar10);
  Output::Print(L"    overall: total %u, no profile info %u\n",
                (ulong)*(uint *)&(((SList<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount> *
                                   )&((FieldAccessStats *)local_80)->totalInlineCacheCount)->
                                 super_SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount>
                                 ).super_SListNodeBase<Memory::ArenaAllocator>.next,
                (ulong)((FieldAccessStats *)local_80)->noInfoInlineCacheCount);
  Output::Print(L"    mono: total %u, empty %u, cloned %u\n",
                (ulong)((RealCount *)&((FieldAccessStats *)local_80)->monoInlineCacheCount)->count,
                (ulong)((FieldAccessStats *)local_80)->emptyMonoInlineCacheCount,
                (ulong)((FieldAccessStats *)local_80)->clonedMonoInlineCacheCount);
  Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                ,(ulong)((FieldAccessStats *)local_80)->polyInlineCacheCount,
                (ulong)((FieldAccessStats *)local_80)->highUtilPolyInlineCacheCount,
                (ulong)((FieldAccessStats *)local_80)->lowUtilPolyInlineCacheCount,
                (ulong)((FieldAccessStats *)local_80)->nullPolyInlineCacheCount,
                (ulong)((FieldAccessStats *)local_80)->emptyPolyInlineCacheCount,
                (ulong)((FieldAccessStats *)local_80)->ignoredPolyInlineCacheCount,
                (ulong)((FieldAccessStats *)local_80)->disabledPolyInlineCacheCount,
                (ulong)((FieldAccessStats *)local_80)->equivPolyInlineCacheCount,
                (ulong)((FieldAccessStats *)local_80)->nonEquivPolyInlineCacheCount,
                (ulong)((FieldAccessStats *)local_80)->clonedPolyInlineCacheCount);
LAB_0058fd80:
  uVar16 = ((RealCount *)&(objTypeSpecFldInfoList.ptr)->monoInlineCacheCount)->count;
  count = (ulong)uVar16;
  local_80 = &Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>::typeinfo;
  stats.ptr = (FieldAccessStats *)0x0;
  this_02 = Memory::Recycler::TrackAllocInfo(pRVar15,(TrackAllocData *)&stack0xffffffffffffff80);
  array = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>,false>
                    ((Memory *)this_02,(Recycler *)Memory::Recycler::Alloc,0,count);
  Js::FunctionCodeGenJitTimeData::SetGlobalObjTypeSpecFldInfoArray(jitTimeData,array,uVar16);
  local_80 = (undefined **)objTypeSpecFldInfoList.ptr;
  stats.ptr = objTypeSpecFldInfoList.ptr;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    uVar16 = (int)count - 1;
    count = (ulong)uVar16;
    if (objTypeSpecFldInfoList.ptr == (FieldAccessStats *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_0058ff7b;
      *puVar9 = 0;
      objTypeSpecFldInfoList = stats;
    }
    if (*objTypeSpecFldInfoList.ptr == (FieldAccessStats *)local_80) {
      Js::ScriptContext::ReleaseTemporaryAllocator(this->scriptContext,tempAllocator);
      pNVar13 = Js::EntryPointInfo::GetNativeEntryPointData(entryPoint);
      runtimeInfo = NativeEntryPointData::EnsurePolymorphicInlineCacheInfo
                              (pNVar13,pRVar15,workItem->functionBody);
      JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo
                (pRVar15,runtimeInfo,&workItem->jitData);
      selfInfo = (workItem->jitData).selfInfo;
      Js::FunctionCodeGenJitTimeData::SetPolymorphicInlineInfo
                (jitTimeData,(workItem->jitData).inlineeInfo,selfInfo,
                 (selfInfo->polymorphicInlineCaches).ptr);
      local_80 = &Js::CodeGenRecyclableData::typeinfo;
      stats.ptr = (FieldAccessStats *)0x0;
      pRVar15 = Memory::Recycler::TrackAllocInfo(pRVar15,(TrackAllocData *)&stack0xffffffffffffff80)
      ;
      this_03 = (CodeGenRecyclableData *)new<Memory::Recycler>(0x18,pRVar15,0x37a1d4);
      Js::CodeGenRecyclableData::CodeGenRecyclableData(this_03,jitTimeData);
      InliningDecider::~InliningDecider((InliningDecider *)local_e8);
      GatherCodeGenData::AutoProfile::~AutoProfile(&local_58);
      return this_03;
    }
    stats.ptr = *objTypeSpecFldInfoList.ptr;
    ppOVar14 = SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&stack0xffffffffffffff80);
    bVar4 = ObjTypeSpecFldInfo::GetKeepFieldValue(*ppOVar14);
    if (!bVar4) {
      bVar4 = ObjTypeSpecFldInfo::IsPoly(*ppOVar14);
      if (bVar4) {
        bVar4 = ObjTypeSpecFldInfo::DoesntHaveEquivalence(*ppOVar14);
        if (bVar4) goto LAB_0058fe8a;
      }
      ObjTypeSpecFldInfo::SetFieldValue(*ppOVar14,(Var)0x0);
    }
LAB_0058fe8a:
    Js::FunctionCodeGenJitTimeData::SetGlobalObjTypeSpecFldInfo(jitTimeData,uVar16,*ppOVar14);
    objTypeSpecFldInfoList = stats;
  } while( true );
}

Assistant:

Js::CodeGenRecyclableData *
NativeCodeGenerator::GatherCodeGenData(Js::FunctionBody *const topFunctionBody, Js::FunctionBody *const functionBody, Js::EntryPointInfo *const entryPoint, CodeGenWorkItem* workItem, void* function)
{
    ASSERT_THREAD();
    Assert(functionBody);

#ifdef PROFILE_EXEC
    class AutoProfile
    {
    private:
        Js::ScriptContextProfiler *const codeGenProfiler;

    public:
        AutoProfile(Js::ScriptContextProfiler *const codeGenProfiler) : codeGenProfiler(codeGenProfiler)
        {
            ProfileBegin(codeGenProfiler, Js::DelayPhase);
            ProfileBegin(codeGenProfiler, Js::GatherCodeGenDataPhase);
        }

        ~AutoProfile()
        {
            ProfileEnd(codeGenProfiler, Js::GatherCodeGenDataPhase);
            ProfileEnd(codeGenProfiler, Js::DelayPhase);
        }
    } autoProfile(foregroundCodeGenProfiler);
#endif

    UpdateJITState();

    const auto recycler = scriptContext->GetRecycler();
    {
        const auto jitTimeData = Js::FunctionCodeGenJitTimeData::New(recycler, functionBody->GetFunctionInfo(), entryPoint);
        InliningDecider inliningDecider(functionBody, workItem->Type() == JsLoopBodyWorkItemType, functionBody->IsInDebugMode(), workItem->GetJitMode());

        BEGIN_TEMP_ALLOCATOR(gatherCodeGenDataAllocator, scriptContext, _u("GatherCodeGenData"));

        ObjTypeSpecFldInfoList* objTypeSpecFldInfoList = JitAnew(gatherCodeGenDataAllocator, ObjTypeSpecFldInfoList, gatherCodeGenDataAllocator);

#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
        {
            Output::Print(_u("ObjTypeSpec: top function %s (%s), function %s (%s): GatherCodeGenData(): \n"),
                topFunctionBody->GetDisplayName(), topFunctionBody->GetDebugNumberSet(debugStringBuffer), functionBody->GetDisplayName(), functionBody->GetDebugNumberSet(debugStringBuffer2));
        }
#endif
        GatherCodeGenData<false>(recycler, topFunctionBody, functionBody, entryPoint, inliningDecider, objTypeSpecFldInfoList, jitTimeData, nullptr, function ? Js::VarTo<Js::JavascriptFunction>(function) : nullptr, 0);

        jitTimeData->sharedPropertyGuards = entryPoint->GetNativeEntryPointData()->GetSharedPropertyGuards(recycler, jitTimeData->sharedPropertyGuardCount);

#ifdef FIELD_ACCESS_STATS
        Js::FieldAccessStats* fieldAccessStats = entryPoint->EnsureFieldAccessStats(recycler);
        fieldAccessStats->Add(jitTimeData->inlineCacheStats);
        entryPoint->GetScriptContext()->RecordFieldAccessStats(topFunctionBody, fieldAccessStats);
#endif

#ifdef FIELD_ACCESS_STATS
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
        {
            auto stats = jitTimeData->inlineCacheStats;
            Output::Print(_u("ObjTypeSpec: gathered code gen data for function %s (%s): inline cache stats:\n"), topFunctionBody->GetDisplayName(), topFunctionBody->GetDebugNumberSet(debugStringBuffer));
            Output::Print(_u("    overall: total %u, no profile info %u\n"), stats->totalInlineCacheCount, stats->noInfoInlineCacheCount);
            Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
                stats->monoInlineCacheCount, stats->emptyMonoInlineCacheCount, stats->clonedMonoInlineCacheCount);
            Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
                stats->polyInlineCacheCount, stats->highUtilPolyInlineCacheCount, stats->lowUtilPolyInlineCacheCount,
                stats->nullPolyInlineCacheCount, stats->emptyPolyInlineCacheCount, stats->ignoredPolyInlineCacheCount, stats->disabledPolyInlineCacheCount,
                stats->equivPolyInlineCacheCount, stats->nonEquivPolyInlineCacheCount, stats->clonedPolyInlineCacheCount);
        }
#endif

        uint objTypeSpecFldInfoCount = objTypeSpecFldInfoList->Count();
        jitTimeData->SetGlobalObjTypeSpecFldInfoArray(RecyclerNewArray(recycler, Field(ObjTypeSpecFldInfo*), objTypeSpecFldInfoCount), objTypeSpecFldInfoCount);
        uint propertyInfoId = objTypeSpecFldInfoCount - 1;
        FOREACH_SLISTCOUNTED_ENTRY(ObjTypeSpecFldInfo*, info, objTypeSpecFldInfoList)
        {
            // Clear field values we don't need so we don't unnecessarily pin them while JIT-ing.
            if (!info->GetKeepFieldValue() && !(info->IsPoly() && info->DoesntHaveEquivalence()))
            {
                info->SetFieldValue(nullptr);
            }
            jitTimeData->SetGlobalObjTypeSpecFldInfo(propertyInfoId--, info);
        }
        NEXT_SLISTCOUNTED_ENTRY;

        END_TEMP_ALLOCATOR(gatherCodeGenDataAllocator, scriptContext);


        auto jitData = workItem->GetJITData();

        JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo(
            recycler,
            entryPoint->GetNativeEntryPointData()->EnsurePolymorphicInlineCacheInfo(recycler, workItem->GetFunctionBody()),
            jitData);

        jitTimeData->SetPolymorphicInlineInfo(jitData->inlineeInfo, jitData->selfInfo, jitData->selfInfo->polymorphicInlineCaches);

        return RecyclerNew(recycler, Js::CodeGenRecyclableData, jitTimeData);
    }
}